

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

Value __thiscall lsim::Simulator::read_pin_current_step(Simulator *this,pin_t pin)

{
  pointer puVar1;
  pointer pVVar2;
  ulong uVar3;
  
  puVar1 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_pin_nodes).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= (ulong)pin) {
    __assert_fail("pin < m_pin_nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,100,"Value lsim::Simulator::read_pin_current_step(pin_t) const");
  }
  uVar3 = (ulong)puVar1[pin];
  pVVar2 = (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->m_node_values_write).
                            super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pVVar2 >> 2)) {
    return pVVar2[uVar3];
  }
  __assert_fail("node_id < m_node_values_write.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xf1,"Value lsim::Simulator::read_node_current_step(node_t) const");
}

Assistant:

Value Simulator::read_pin_current_step(pin_t pin) const {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    return read_node_current_step(node_id);
}